

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

int rb_read_uniform(aom_read_bit_buffer *rb,int n)

{
  int iVar1;
  int iVar2;
  int in_ESI;
  int v;
  int m;
  int l;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  iVar1 = get_unsigned_bits(0);
  iVar2 = (1 << ((byte)iVar1 & 0x1f)) - in_ESI;
  local_4 = aom_rb_read_literal((aom_read_bit_buffer *)CONCAT44(iVar2,in_stack_ffffffffffffffe0),
                                in_stack_ffffffffffffffdc);
  if (iVar2 <= local_4) {
    iVar2 = local_4 * 2 - iVar2;
    local_4 = aom_rb_read_bit((aom_read_bit_buffer *)CONCAT44(in_ESI,iVar1));
    local_4 = iVar2 + local_4;
  }
  return local_4;
}

Assistant:

static int rb_read_uniform(struct aom_read_bit_buffer *const rb, int n) {
  const int l = get_unsigned_bits(n);
  const int m = (1 << l) - n;
  const int v = aom_rb_read_literal(rb, l - 1);
  assert(l != 0);
  if (v < m)
    return v;
  else
    return (v << 1) - m + aom_rb_read_bit(rb);
}